

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btAlignedObjectArray.h
# Opt level: O3

void __thiscall
btAlignedObjectArray<int>::btAlignedObjectArray
          (btAlignedObjectArray<int> *this,btAlignedObjectArray<int> *otherArray)

{
  size_t size;
  int iVar1;
  int iVar2;
  int *piVar3;
  int *__s;
  long lVar4;
  long lVar5;
  
  this->m_ownsMemory = true;
  this->m_data = (int *)0x0;
  this->m_size = 0;
  this->m_capacity = 0;
  iVar1 = otherArray->m_size;
  lVar5 = (long)iVar1;
  if (lVar5 < 1) {
    this->m_size = iVar1;
    return;
  }
  size = lVar5 * 4;
  __s = (int *)btAlignedAllocInternal(size,0x10);
  iVar2 = this->m_size;
  piVar3 = this->m_data;
  if ((long)iVar2 < 1) {
    if (piVar3 == (int *)0x0) {
      this->m_ownsMemory = true;
      this->m_data = __s;
      this->m_capacity = iVar1;
      memset(__s,0,size);
      this->m_size = iVar1;
      goto LAB_001694c0;
    }
  }
  else {
    lVar4 = 0;
    do {
      __s[lVar4] = piVar3[lVar4];
      lVar4 = lVar4 + 1;
    } while (iVar2 != lVar4);
  }
  if (this->m_ownsMemory == true) {
    btAlignedFreeInternal(piVar3);
  }
  this->m_ownsMemory = true;
  this->m_data = __s;
  this->m_capacity = iVar1;
  memset(__s,0,size);
  this->m_size = iVar1;
  if (iVar1 < 1) {
    return;
  }
LAB_001694c0:
  piVar3 = otherArray->m_data;
  lVar4 = 0;
  do {
    __s[lVar4] = piVar3[lVar4];
    lVar4 = lVar4 + 1;
  } while (lVar5 != lVar4);
  return;
}

Assistant:

btAlignedObjectArray(const btAlignedObjectArray& otherArray)
		{
			init();

			int otherSize = otherArray.size();
			resize (otherSize);
			otherArray.copy(0, otherSize, m_data);
		}